

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLibFunction.cpp
# Opt level: O1

sock brynet::net::base::Accept(sock listenSocket,sockaddr *addr,socklen_t *addrLen)

{
  int iVar1;
  
  iVar1 = accept(listenSocket,(sockaddr *)addr,addrLen);
  return iVar1;
}

Assistant:

sock brynet::net::base::Accept(sock listenSocket, struct sockaddr* addr, socklen_t* addrLen)
{
#if defined PLATFORM_WINDOWS
    sock fd = accept(listenSocket, addr, addrLen);
    if (fd == INVALID_SOCKET)
    {
        fd = SOCKET_ERROR;
    }
    return fd;
#else
    return accept(listenSocket, addr, addrLen);
#endif
}